

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen1_2x3.cpp
# Opt level: O0

void Assimp::IFC::Schema_2x3::GetSchema(ConversionSchema *out)

{
  ConversionSchema local_40;
  ConversionSchema *local_10;
  ConversionSchema *out_local;
  
  local_10 = out;
  STEP::EXPRESS::ConversionSchema::ConversionSchema<980ul>
            (&local_40,(SchemaEntry (*) [980])Assimp::(anonymous_namespace)::schema_raw_2x3);
  STEP::EXPRESS::ConversionSchema::operator=(local_10,&local_40);
  STEP::EXPRESS::ConversionSchema::~ConversionSchema(&local_40);
  return;
}

Assistant:

void IFC::Schema_2x3::GetSchema(EXPRESS::ConversionSchema& out) {
	out = EXPRESS::ConversionSchema(schema_raw_2x3);
}